

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# space_mixer.c
# Opt level: O3

void calculate_volumes(space_source *source,space_mixer_data *data)

{
  undefined1 auVar1 [32];
  uint uVar2;
  undefined1 auVar3 [32];
  uint uVar4;
  mixed_channel_t c;
  ulong uVar6;
  ulong uVar7;
  undefined1 auVar9 [16];
  undefined1 auVar8 [16];
  undefined1 auVar10 [64];
  float fVar11;
  float fVar12;
  float fVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  float x;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  float fVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  mixed_channel_t speaker_count;
  mixed_channel_t speakers [33];
  float volumes [33];
  byte local_109;
  float local_108;
  float fStack_104;
  float local_100;
  float local_f8;
  float local_f4;
  float local_f0;
  float local_ec;
  undefined1 local_e8 [16];
  byte local_d8 [48];
  uint local_a8 [36];
  ulong uVar5;
  undefined4 extraout_XMM0_Db;
  undefined1 extraout_var [56];
  
  local_f4 = source->min_distance;
  auVar21 = ZEXT416((uint)local_f4);
  fVar12 = source->max_distance;
  fVar11 = source->location[0] - data->location[0];
  fVar13 = source->location[1] - data->location[1];
  fVar19 = source->location[2] - data->location[2];
  auVar8 = ZEXT416((uint)(fVar19 * fVar19 + fVar11 * fVar11 + fVar13 * fVar13));
  auVar8 = vsqrtss_avx(auVar8,auVar8);
  auVar8 = vminss_avx(auVar8,ZEXT416((uint)fVar12));
  local_f8 = auVar8._0_4_;
  auVar8 = SUB6416(ZEXT464(0x3f800000),0);
  if ((local_f4 < local_f8) && (local_f4 < fVar12)) {
    local_e8._0_4_ = fVar11;
    local_f0 = fVar13;
    local_ec = fVar19;
    auVar10._0_4_ = (*data->attenuation)(local_f4,fVar12,local_f8,source->rolloff);
    auVar10._4_4_ = extraout_XMM0_Db;
    auVar10._8_56_ = extraout_var;
    auVar8 = auVar10._0_16_;
    auVar21 = ZEXT416((uint)local_f4);
    fVar11 = (float)local_e8._0_4_;
    fVar13 = local_f0;
    fVar19 = local_ec;
  }
  local_e8 = auVar8;
  if (source->spatial == true) {
    local_108 = fVar19 * data->look_at[2] + fVar11 * data->look_at[0] + fVar13 * data->look_at[1];
    fStack_104 = fVar19 * data->look_at[5] + fVar11 * data->look_at[3] + fVar13 * data->look_at[4];
    local_100 = fVar19 * data->look_at[8] + fVar11 * data->look_at[6] + fVar13 * data->look_at[7];
    if (local_f8 < auVar21._0_4_) {
      fVar12 = 1.0 - local_f8 / auVar21._0_4_;
      auVar8 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)(fVar12 + fVar12)));
      fVar11 = auVar8._0_4_;
      fVar12 = 1.0 - fVar11;
      local_108 = local_108 * fVar12 + fVar11 * 0.0;
      fStack_104 = fStack_104 * fVar12 + fVar11 * 0.0;
      local_100 = local_100 * fVar12 + fVar11;
    }
    mixed_compute_gains_resolver(&local_108,local_a8,local_d8,&local_109,&data->vbap);
    uVar5 = (ulong)local_109;
    uVar4 = (uint)local_109;
    if (uVar5 != 0) {
      auVar9._8_8_ = 0;
      auVar9._0_8_ = uVar5 - 1;
      auVar8 = vpshufd_avx(auVar9,0x44);
      auVar9 = vpermilps_avx(local_e8,0);
      uVar7 = 0;
      uVar6 = auVar8._0_8_;
      auVar14._0_8_ = uVar6 ^ 0x8000000000000000;
      auVar14._8_4_ = auVar8._8_4_;
      uVar2 = auVar8._12_4_;
      auVar14._12_4_ = uVar2 ^ 0x80000000;
      auVar17._0_8_ = uVar6 ^ 0x8000000000000000;
      auVar17._8_4_ = auVar14._8_4_;
      auVar17._12_4_ = uVar2 ^ 0x80000000;
      auVar8 = vpcmpeqd_avx(auVar21,auVar21);
      auVar20._0_8_ = uVar6 ^ 0x8000000000000000;
      auVar20._8_4_ = auVar14._8_4_;
      auVar20._12_4_ = uVar2 ^ 0x80000000;
      auVar22._8_4_ = 0x3f800000;
      auVar22._0_8_ = 0x3f8000003f800000;
      auVar22._12_4_ = 0x3f800000;
      auVar22._16_4_ = 0x3f800000;
      auVar22._20_4_ = 0x3f800000;
      auVar22._24_4_ = 0x3f800000;
      auVar22._28_4_ = 0x3f800000;
      do {
        auVar24._8_8_ = 0;
        auVar24._0_8_ = uVar7;
        auVar21 = vpshufd_avx(auVar24,0x44);
        auVar28._16_16_ = auVar21;
        auVar28._0_16_ = auVar21;
        auVar23 = vorps_avx(auVar28,_DAT_002ae2a0);
        auVar1 = vorps_avx(auVar28,_DAT_002ae2c0);
        auVar34._0_8_ = auVar1._16_8_ ^ 0x8000000000000000;
        auVar34._8_4_ = auVar1._24_4_;
        auVar34._12_4_ = auVar1._28_4_ ^ 0x80000000;
        auVar21 = vpcmpgtq_avx(auVar34,auVar14);
        auVar25._0_8_ = auVar1._0_8_ ^ 0x8000000000000000;
        auVar25._8_4_ = auVar1._8_4_;
        auVar25._12_4_ = auVar1._12_4_ ^ 0x80000000;
        auVar16 = vpcmpgtq_avx(auVar25,auVar17);
        auVar21 = vpackssdw_avx(auVar16,auVar21);
        auVar35._0_8_ = auVar23._16_8_ ^ 0x8000000000000000;
        auVar35._8_4_ = auVar23._24_4_;
        auVar35._12_4_ = auVar23._28_4_ ^ 0x80000000;
        auVar16 = vpcmpgtq_avx(auVar35,auVar14);
        auVar32._0_8_ = auVar23._0_8_ ^ 0x8000000000000000;
        auVar32._8_4_ = auVar23._8_4_;
        auVar32._12_4_ = auVar23._12_4_ ^ 0x80000000;
        auVar18 = vpcmpgtq_avx(auVar32,auVar20);
        auVar16 = vpackssdw_avx(auVar18,auVar16);
        auVar21 = vpackssdw_avx(auVar16 ^ auVar8,auVar21 ^ auVar8);
        auVar16 = vpmovsxwd_avx(auVar21);
        auVar21 = vpunpckhwd_avx(auVar21,auVar21);
        auVar29._16_16_ = auVar21;
        auVar29._0_16_ = auVar16;
        auVar23 = vmaskmovps_avx(auVar29,*(undefined1 (*) [32])(local_a8 + uVar7));
        auVar3._4_4_ = auVar23._4_4_ * auVar9._4_4_;
        auVar3._0_4_ = auVar23._0_4_ * auVar9._0_4_;
        auVar3._8_4_ = auVar23._8_4_ * auVar9._8_4_;
        auVar3._12_4_ = auVar23._12_4_ * auVar9._12_4_;
        auVar3._16_4_ = auVar23._16_4_ * auVar9._0_4_;
        auVar3._20_4_ = auVar23._20_4_ * auVar9._4_4_;
        auVar3._24_4_ = auVar23._24_4_ * auVar9._8_4_;
        auVar3._28_4_ = auVar23._28_4_;
        auVar23 = vminps_avx(auVar22,auVar3);
        auVar23 = vmaskmovps_avx(auVar29,auVar23);
        *(undefined1 (*) [32])(local_a8 + uVar7) = auVar23;
        uVar7 = uVar7 + 8;
      } while ((local_109 + 7 & 0xfffffff8) != uVar7);
    }
    if ((local_f4 < local_f8) && (data->surround == false)) {
      auVar8 = ZEXT416((uint)(local_100 * local_100 +
                             local_108 * local_108 + fStack_104 * fStack_104));
      auVar8 = vsqrtss_avx(auVar8,auVar8);
      fVar12 = auVar8._0_4_;
      auVar15._0_4_ = local_100 / fVar12;
      auVar15._4_12_ = SUB6012((undefined1  [60])0x0,0);
      if (0.0 < fVar12) {
        fVar11 = local_108 / fVar12;
      }
      else {
        fVar11 = 0.0;
      }
      auVar8 = vcmpss_avx(ZEXT816(0),auVar8,1);
      auVar8 = vandps_avx(auVar8,auVar15);
      if (0.0 < fVar12) {
        fVar12 = (fStack_104 / fVar12) * 0.0;
      }
      else {
        fVar12 = 0.0;
      }
      if (local_109 != 0 && auVar8._0_4_ + fVar11 * 0.0 + fVar12 < 0.0) {
        uVar6 = 0;
        do {
          uVar7 = (ulong)(data->channels).positions[local_d8[uVar6]];
          if ((uVar7 < 0x21) && ((0x122020202U >> (uVar7 & 0x3f) & 1) != 0)) {
            local_a8[uVar6] = local_a8[uVar6] ^ 0x80000000;
          }
          uVar6 = uVar6 + 1;
        } while (uVar5 != uVar6);
      }
    }
  }
  else {
    local_108 = 0.0;
    fStack_104 = 0.0;
    local_100 = 0.0;
    mixed_compute_gains_resolver(&local_108,local_a8,local_d8,&local_109,&data->vbap);
    uVar4 = (uint)local_109;
    if ((ulong)local_109 == 0) {
      uVar4 = 0;
    }
    else {
      auVar8._8_8_ = 0;
      auVar8._0_8_ = (ulong)local_109 - 1;
      auVar8 = vpshufd_avx(auVar8,0x44);
      auVar9 = vpermilps_avx(local_e8,0);
      uVar6 = 0;
      uVar5 = auVar8._0_8_;
      auVar16._0_8_ = uVar5 ^ 0x8000000000000000;
      auVar16._8_4_ = auVar8._8_4_;
      uVar2 = auVar8._12_4_;
      auVar16._12_4_ = uVar2 ^ 0x80000000;
      auVar18._0_8_ = uVar5 ^ 0x8000000000000000;
      auVar18._8_4_ = auVar16._8_4_;
      auVar18._12_4_ = uVar2 ^ 0x80000000;
      auVar8 = vpcmpeqd_avx(auVar21,auVar21);
      auVar21._0_8_ = uVar5 ^ 0x8000000000000000;
      auVar21._8_4_ = auVar16._8_4_;
      auVar21._12_4_ = uVar2 ^ 0x80000000;
      auVar23._8_4_ = 0x3f800000;
      auVar23._0_8_ = 0x3f8000003f800000;
      auVar23._12_4_ = 0x3f800000;
      auVar23._16_4_ = 0x3f800000;
      auVar23._20_4_ = 0x3f800000;
      auVar23._24_4_ = 0x3f800000;
      auVar23._28_4_ = 0x3f800000;
      do {
        auVar26._8_8_ = 0;
        auVar26._0_8_ = uVar6;
        auVar26 = vpshufd_avx(auVar26,0x44);
        auVar30._16_16_ = auVar26;
        auVar30._0_16_ = auVar26;
        auVar22 = vorps_avx(auVar30,_DAT_002ae2a0);
        auVar1 = vorps_avx(auVar30,_DAT_002ae2c0);
        auVar36._0_8_ = auVar1._16_8_ ^ 0x8000000000000000;
        auVar36._8_4_ = auVar1._24_4_;
        auVar36._12_4_ = auVar1._28_4_ ^ 0x80000000;
        auVar26 = vpcmpgtq_avx(auVar36,auVar16);
        auVar27._0_8_ = auVar1._0_8_ ^ 0x8000000000000000;
        auVar27._8_4_ = auVar1._8_4_;
        auVar27._12_4_ = auVar1._12_4_ ^ 0x80000000;
        auVar27 = vpcmpgtq_avx(auVar27,auVar18);
        auVar26 = vpackssdw_avx(auVar27,auVar26);
        auVar37._0_8_ = auVar22._16_8_ ^ 0x8000000000000000;
        auVar37._8_4_ = auVar22._24_4_;
        auVar37._12_4_ = auVar22._28_4_ ^ 0x80000000;
        auVar27 = vpcmpgtq_avx(auVar37,auVar16);
        auVar33._0_8_ = auVar22._0_8_ ^ 0x8000000000000000;
        auVar33._8_4_ = auVar22._8_4_;
        auVar33._12_4_ = auVar22._12_4_ ^ 0x80000000;
        auVar33 = vpcmpgtq_avx(auVar33,auVar21);
        auVar27 = vpackssdw_avx(auVar33,auVar27);
        auVar26 = vpackssdw_avx(auVar27 ^ auVar8,auVar26 ^ auVar8);
        auVar27 = vpmovsxwd_avx(auVar26);
        auVar26 = vpunpckhwd_avx(auVar26,auVar26);
        auVar31._16_16_ = auVar26;
        auVar31._0_16_ = auVar27;
        auVar22 = vmaskmovps_avx(auVar31,*(undefined1 (*) [32])(local_a8 + uVar6));
        auVar1._4_4_ = auVar22._4_4_ * auVar9._4_4_;
        auVar1._0_4_ = auVar22._0_4_ * auVar9._0_4_;
        auVar1._8_4_ = auVar22._8_4_ * auVar9._8_4_;
        auVar1._12_4_ = auVar22._12_4_ * auVar9._12_4_;
        auVar1._16_4_ = auVar22._16_4_ * auVar9._0_4_;
        auVar1._20_4_ = auVar22._20_4_ * auVar9._4_4_;
        auVar1._24_4_ = auVar22._24_4_ * auVar9._8_4_;
        auVar1._28_4_ = auVar22._28_4_;
        auVar22 = vminps_avx(auVar23,auVar1);
        auVar22 = vmaskmovps_avx(auVar31,auVar22);
        *(undefined1 (*) [32])(local_a8 + uVar6) = auVar22;
        uVar6 = uVar6 + 8;
      } while ((local_109 + 7 & 0xfffffff8) != uVar6);
    }
  }
  memcpy(source->volumes,local_a8,(ulong)(uVar4 * 4));
  memcpy(source->speakers,local_d8,(ulong)(uVar4 * 4));
  source->speaker_count = (mixed_channel_t)uVar4;
  return;
}

Assistant:

VECTORIZE static void calculate_volumes(struct space_source *source, struct space_mixer_data *data){
  float volumes[MIXED_MAX_SPEAKER_COUNT];
  mixed_channel_t speakers[MIXED_MAX_SPEAKER_COUNT];
  mixed_channel_t speaker_count;
  float forward[3] = {0.0, 0.0, 1.0};
  float min = source->min_distance;
  float max = source->max_distance;
  float roll = source->rolloff;
  // Relative location to our listener
  float location[3] = {source->location[0]-data->location[0],
                       source->location[1]-data->location[1],
                       source->location[2]-data->location[2]};
  float distance = MIN(vec_length(location), max);
  float volume = 1.0;
  if(min < distance && min < max){
    volume *= data->attenuation(min, max, distance, roll);
  }
  if(source->spatial){
    // Bring the location into our reference frame
    vec_mul(location, data->look_at, location);
    // If we are below min distance, bend towards forward
    if(distance < min){
      vec_lerp(location, location, forward, MIN(1.0, (1-distance/min)*2));
    }
    // Compute the actual gain factors using VBAP
    mixed_compute_gains(location, volumes, speakers, &speaker_count, &data->vbap);
    for(mixed_channel_t c=0; c<speaker_count; ++c){
      volumes[c] = MIN(1.0, volume*volumes[c]);
    }
    // If we are not on a surround setup, we can simulate the sound appearing
    // from behind by inverting the right channels, causing a phase shift.
    // Only do this when the sound is far enough away though as otherwise it
    // can lead to frequent fluctuations, which sound very... bad.
    if(!data->surround && min < distance && calculate_phase(location) < 0){
      for(mixed_channel_t c=0; c<speaker_count; ++c){
        switch(data->channels.positions[speakers[c]]){
        case MIXED_RIGHT_FRONT_BOTTOM:
        case MIXED_RIGHT_FRONT_TOP:
        case MIXED_RIGHT_FRONT_WIDE:
        case MIXED_RIGHT_FRONT_HIGH:
        case MIXED_RIGHT_CENTER_BOTTOM:
        case MIXED_RIGHT_FRONT_CENTER_BOTTOM:
          volumes[c] *= -1.0;
        }
      }
    }
  }else{
    location[0] = 0.0;
    location[1] = 0.0;
    location[2] = 0.0;
    mixed_compute_gains(location, volumes, speakers, &speaker_count, &data->vbap);
    for(mixed_channel_t c=0; c<speaker_count; ++c){
      volumes[c] = MIN(1.0, volume*volumes[c]);
    }
  }
  // Cache
  memcpy(source->volumes, volumes, sizeof(float)*speaker_count);
  memcpy(source->speakers, speakers, sizeof(float)*speaker_count);
  source->speaker_count = speaker_count;
}